

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2plus.hpp
# Opt level: O0

void __thiscall
trng::lagfib2plus<unsigned_int,_168U,_521U>::discard
          (lagfib2plus<unsigned_int,_168U,_521U> *this,unsigned_long_long n)

{
  unsigned_long_long uVar1;
  reference pvVar2;
  reference pvVar3;
  ulong in_RSI;
  lagfib2plus<unsigned_int,_168U,_521U> *in_RDI;
  unsigned_long_long i_3;
  size_type i_2;
  size_type i_1;
  vector_type V;
  size_type i;
  matrix_type M;
  unsigned_long_long n_partial;
  uint mask;
  unsigned_long_long n_pivot;
  uint matrix_size;
  vector<unsigned_int,_521UL> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  value_type in_stack_ffffffffffffff14;
  matrix<unsigned_int,_521UL> *in_stack_ffffffffffffff30;
  ulong local_c0;
  ulong local_b8;
  ulong local_98;
  unsigned_long_long in_stack_ffffffffffffff70;
  matrix<unsigned_int,_521UL> *in_stack_ffffffffffffff78;
  ulong local_50;
  ulong local_10;
  
  uVar1 = int_math::log2_ceil<unsigned_long_long>
                    (CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_10 = in_RSI;
  if (uVar1 * 0x86de8d9 < in_RSI) {
    matrix<unsigned_int,_521UL>::matrix(in_stack_ffffffffffffff30);
    for (local_50 = 0; local_50 < 0x208; local_50 = local_50 + 1) {
      in_stack_ffffffffffffff30 =
           (matrix<unsigned_int,_521UL> *)
           matrix<unsigned_int,_521UL>::operator()
                     ((matrix<unsigned_int,_521UL> *)
                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (size_type)in_stack_ffffffffffffff08,0x2d8db2);
      *(value_type *)
       &(in_stack_ffffffffffffff30->data).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = 1;
    }
    pvVar2 = matrix<unsigned_int,_521UL>::operator()
                       ((matrix<unsigned_int,_521UL> *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        (size_type)in_stack_ffffffffffffff08,0x2d8e09);
    *pvVar2 = 1;
    pvVar2 = matrix<unsigned_int,_521UL>::operator()
                       ((matrix<unsigned_int,_521UL> *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        (size_type)in_stack_ffffffffffffff08,0x2d8e32);
    *pvVar2 = 1;
    power<unsigned_int,521ul>(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    matrix<unsigned_int,_521UL>::operator=
              ((matrix<unsigned_int,_521UL> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (matrix<unsigned_int,_521UL> *)in_stack_ffffffffffffff08);
    matrix<unsigned_int,_521UL>::~matrix((matrix<unsigned_int,_521UL> *)0x2d8e87);
    vector<unsigned_int,_521UL>::vector((vector<unsigned_int,_521UL> *)in_stack_ffffffffffffff30);
    for (local_98 = 0; local_98 < 0x209; local_98 = local_98 + 1) {
      in_stack_ffffffffffffff14 =
           *(value_type *)
            ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI->S).r)->
                    _M_impl).super__Vector_impl_data._M_start +
            ((in_RDI->S).index - local_98 & 0x3ff) * 4);
      pvVar3 = vector<unsigned_int,_521UL>::operator()
                         ((vector<unsigned_int,_521UL> *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (size_type)in_stack_ffffffffffffff08);
      *pvVar3 = in_stack_ffffffffffffff14;
    }
    trng::operator*((matrix<unsigned_int,_521UL> *)in_RDI,
                    (vector<unsigned_int,_521UL> *)in_stack_ffffffffffffff30);
    vector<unsigned_int,_521UL>::operator=
              ((vector<unsigned_int,_521UL> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    vector<unsigned_int,_521UL>::~vector((vector<unsigned_int,_521UL> *)0x2d8f21);
    (in_RDI->S).index = (in_RDI->S).index + (int)(in_RSI - 0x209);
    (in_RDI->S).index = (in_RDI->S).index & 0x3ff;
    for (local_b8 = 0; local_b8 < 0x209; local_b8 = local_b8 + 1) {
      pvVar3 = vector<unsigned_int,_521UL>::operator()
                         ((vector<unsigned_int,_521UL> *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (size_type)in_stack_ffffffffffffff08);
      *(value_type *)
       ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI->S).r)->
               _M_impl).super__Vector_impl_data._M_start +
       ((in_RDI->S).index - local_b8 & 0x3ff) * 4) = *pvVar3;
    }
    local_10 = in_RSI - (in_RSI - 0x209);
    vector<unsigned_int,_521UL>::~vector((vector<unsigned_int,_521UL> *)0x2d8fe8);
    matrix<unsigned_int,_521UL>::~matrix((matrix<unsigned_int,_521UL> *)0x2d8ff5);
  }
  for (local_c0 = 0; local_c0 < local_10; local_c0 = local_c0 + 1) {
    step(in_RDI);
  }
  return;
}

Assistant:

void discard(unsigned long long n) {
      const unsigned int matrix_size = B;
      using matrix_type = matrix<result_type, matrix_size>;
      using vector_type = vector<result_type, matrix_size>;
      using size_type = typename matrix_type::size_type;
      const unsigned long long n_pivot{int_math::log2_ceil(n) * B * B * B};
      constexpr auto mask = int_math::mask(B);
      if (n > n_pivot) {
        const unsigned long long n_partial{n - matrix_size};
        matrix_type M;
        for (size_type i{0}; i < matrix_size - 1; ++i)
          M(i, i + 1) = 1;
        M(matrix_size - 1, matrix_size - B) = 1;
        M(matrix_size - 1, matrix_size - A) = 1;
        M = power(M, n_partial);
        vector_type V;
        for (size_type i{0}; i < matrix_size; ++i)
          V(matrix_size - 1 - i) = S.r[(S.index - i) & mask];
        V = M * V;
        S.index = static_cast<unsigned int>(S.index + n_partial);
        S.index &= mask;
        for (size_type i{0}; i < matrix_size; ++i)
          S.r[(S.index - i) & mask] = V(matrix_size - 1 - i);
        n -= n_partial;
      }
      for (unsigned long long i{0}; i < n; ++i)
        step();
    }